

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O0

cuddPathPair getShortest(DdNode *root,int *cost,int *support,st__table *visited)

{
  DdNode *root_00;
  int iVar1;
  DdNode *key;
  cuddPathPair cVar2;
  cuddPathPair cVar3;
  int local_84;
  int local_80;
  int local_7c;
  int tmp;
  int weight;
  DdNode *E;
  DdNode *T;
  DdNode *my_root;
  cuddPathPair pair_E;
  cuddPathPair pair_T;
  cuddPathPair *my_pair;
  st__table *visited_local;
  int *support_local;
  int *cost_local;
  DdNode *root_local;
  cuddPathPair res_pair;
  
  key = (DdNode *)((ulong)root & 0xfffffffffffffffe);
  iVar1 = st__lookup(visited,(char *)key,(char **)&pair_T);
  if (iVar1 == 0) {
    if (key->index == 0x7fffffff) {
      if (key == zero) {
        root_local._0_4_ = 1000000;
        root_local._4_4_ = 0;
      }
      else {
        root_local._0_4_ = 0;
        root_local._4_4_ = 1000000;
      }
    }
    else {
      root_00 = (key->type).kids.E;
      cVar2 = getShortest((key->type).kids.T,cost,support,visited);
      cVar3 = getShortest(root_00,cost,support,visited);
      if (cost == (int *)0x0) {
        local_7c = 1;
      }
      else {
        local_7c = cost[key->index];
      }
      my_root._0_4_ = cVar3.pos;
      pair_E.pos = cVar2.pos;
      if ((int)my_root < pair_E.pos + local_7c) {
        local_80 = (int)my_root;
      }
      else {
        local_80 = pair_E.pos + local_7c;
      }
      root_local._0_4_ = local_80;
      my_root._4_4_ = cVar3.neg;
      pair_E.neg = cVar2.neg;
      if (my_root._4_4_ < pair_E.neg + local_7c) {
        local_84 = my_root._4_4_;
      }
      else {
        local_84 = pair_E.neg + local_7c;
      }
      root_local._4_4_ = local_84;
      if (support != (int *)0x0) {
        support[key->index] = 1;
      }
    }
    iVar1 = (int)root_local;
    pair_T = (cuddPathPair)malloc(8);
    if (pair_T == (cuddPathPair)0x0) {
      if (((ulong)root & 1) != 0) {
        root_local._0_4_ = root_local._4_4_;
        root_local._4_4_ = iVar1;
      }
    }
    else {
      *(int *)pair_T = (int)root_local;
      *(int *)((long)pair_T + 4) = root_local._4_4_;
      st__insert(visited,(char *)key,(char *)pair_T);
      if (((ulong)root & 1) == 0) {
        root_local._0_4_ = *(int *)pair_T;
        root_local._4_4_ = *(int *)((long)pair_T + 4);
      }
      else {
        root_local._0_4_ = *(int *)((long)pair_T + 4);
        root_local._4_4_ = *(int *)pair_T;
      }
    }
  }
  else if (((ulong)root & 1) == 0) {
    root_local._0_4_ = *(int *)pair_T;
    root_local._4_4_ = *(int *)((long)pair_T + 4);
  }
  else {
    root_local._0_4_ = *(int *)((long)pair_T + 4);
    root_local._4_4_ = *(int *)pair_T;
  }
  cVar2.neg = root_local._4_4_;
  cVar2.pos = (int)root_local;
  return cVar2;
}

Assistant:

static cuddPathPair
getShortest(
  DdNode * root,
  int * cost,
  int * support,
  st__table * visited)
{
    cuddPathPair *my_pair, res_pair, pair_T, pair_E;
    DdNode      *my_root, *T, *E;
    int         weight;

    my_root = Cudd_Regular(root);

    if ( st__lookup(visited, (const char *)my_root, (char **)&my_pair)) {
        if (Cudd_IsComplement(root)) {
            res_pair.pos = my_pair->neg;
            res_pair.neg = my_pair->pos;
        } else {
            res_pair.pos = my_pair->pos;
            res_pair.neg = my_pair->neg;
        }
        return(res_pair);
    }

    /* In the case of a BDD the following test is equivalent to
    ** testing whether the BDD is the constant 1. This formulation,
    ** however, works for ADDs as well, by assuming the usual
    ** dichotomy of 0 and != 0.
    */
    if (cuddIsConstant(my_root)) {
        if (my_root != zero) {
            res_pair.pos = 0;
            res_pair.neg = DD_BIGGY;
        } else {
            res_pair.pos = DD_BIGGY;
            res_pair.neg = 0;
        }
    } else {
        T = cuddT(my_root);
        E = cuddE(my_root);

        pair_T = getShortest(T, cost, support, visited);
        pair_E = getShortest(E, cost, support, visited);
        weight = WEIGHT(cost, my_root->index);
        res_pair.pos = ddMin(pair_T.pos+weight, pair_E.pos);
        res_pair.neg = ddMin(pair_T.neg+weight, pair_E.neg);

        /* Update support. */
        if (support != NULL) {
            support[my_root->index] = 1;
        }
    }

    my_pair = ABC_ALLOC(cuddPathPair, 1);
    if (my_pair == NULL) {
        if (Cudd_IsComplement(root)) {
            int tmp = res_pair.pos;
            res_pair.pos = res_pair.neg;
            res_pair.neg = tmp;
        }
        return(res_pair);
    }
    my_pair->pos = res_pair.pos;
    my_pair->neg = res_pair.neg;

    st__insert(visited, (char *)my_root, (char *)my_pair);
    if (Cudd_IsComplement(root)) {
        res_pair.pos = my_pair->neg;
        res_pair.neg = my_pair->pos;
    } else {
        res_pair.pos = my_pair->pos;
        res_pair.neg = my_pair->neg;
    }
    return(res_pair);

}